

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.c
# Opt level: O1

_Bool conf_get_bool(Conf *conf,int primary)

{
  void *pvVar1;
  key key;
  int local_10 [4];
  
  if (subkeytypes[primary] != 0) {
    __assert_fail("subkeytypes[primary] == TYPE_NONE",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/conf.c",
                  0x10e,"_Bool conf_get_bool(Conf *, int)");
  }
  if (valuetypes[primary] == 1) {
    local_10[0] = primary;
    pvVar1 = find234(conf->tree,local_10,(cmpfn234_conflict)0x0);
    if (pvVar1 != (void *)0x0) {
      return (_Bool)*(undefined1 *)((long)pvVar1 + 0x10);
    }
    __assert_fail("entry",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/conf.c",
                  0x112,"_Bool conf_get_bool(Conf *, int)");
  }
  __assert_fail("valuetypes[primary] == TYPE_BOOL",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/conf.c",
                0x10f,"_Bool conf_get_bool(Conf *, int)");
}

Assistant:

bool conf_get_bool(Conf *conf, int primary)
{
    struct key key;
    struct conf_entry *entry;

    assert(subkeytypes[primary] == TYPE_NONE);
    assert(valuetypes[primary] == TYPE_BOOL);
    key.primary = primary;
    entry = find234(conf->tree, &key, NULL);
    assert(entry);
    return entry->value.u.boolval;
}